

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> __thiscall
fmt::v8::detail::
write_int_noinline<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long>
          (detail *this,back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,
          write_int_arg<unsigned_long> arg,basic_format_specs<char16_t> *specs,locale_ref loc)

{
  ulong uVar1;
  presentation_type pVar2;
  long lVar3;
  size_t sVar4;
  uint uVar5;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar6;
  ushort *puVar7;
  short *psVar8;
  byte *pbVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  basic_format_specs<char16_t> *specs_00;
  char *pcVar13;
  char *pcVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  format_decimal_result<char16_t_*> fVar20;
  write_int_data<char16_t> data;
  char16_t buffer [20];
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_90;
  write_int_data<char16_t> local_88;
  anon_class_40_3_03e05ccd_conflict local_78;
  
  specs_00 = arg._8_8_;
  pVar2 = specs_00->type;
  uVar12 = (uint)arg.abs_value;
  local_90.container = (buffer<char16_t> *)this;
  local_78.write_digits.abs_value = (unsigned_long)out.container;
  switch(pVar2) {
  case none:
  case dec:
    if (((specs_00->field_0xa & 1) != 0) &&
       (bVar19 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long,char16_t>
                           (&local_90,(unsigned_long)out.container,uVar12,specs_00,(locale_ref)specs
                           ), bVar19)) {
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)local_90.container;
    }
    bVar6.container = local_90.container;
    lVar16 = 0x3f;
    if (((ulong)out.container | 1) != 0) {
      for (; ((ulong)out.container | 1) >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    iVar15 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar16] -
             (uint)(out.container <
                   *(buffer<char16_t> **)
                    (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                    (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar16] * 8));
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char16_t>::write_int_data(&local_88,iVar15,uVar12,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar12;
      local_78.write_digits.num_digits = iVar15;
      bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                        (bVar6,specs_00,local_88.size,local_88.size,
                         (anon_class_40_3_03e05ccd *)&local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar6.container;
    }
    if (-1 < iVar15) {
      if ((uVar12 != 0) &&
         (uVar12 = uVar12 & 0xffffff,
         ((undefined1  [16])arg & (undefined1  [16])0xffffff) != (undefined1  [16])0x0)) {
        do {
          if ((bVar6.container)->capacity_ < (bVar6.container)->size_ + 1) {
            (**(bVar6.container)->_vptr_buffer)(bVar6.container);
          }
          sVar4 = (bVar6.container)->size_;
          (bVar6.container)->size_ = sVar4 + 1;
          (bVar6.container)->ptr_[sVar4] = (ushort)uVar12 & 0xff;
          bVar19 = 0xff < uVar12;
          uVar12 = uVar12 >> 8;
        } while (bVar19);
      }
      fVar20 = format_decimal<char16_t,unsigned_long>
                         ((char16_t *)&local_78,(unsigned_long)out.container,iVar15);
      bVar6 = copy_str_noinline<char16_t,char16_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                        ((char16_t *)&local_78,fVar20.end,bVar6);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar6.container;
    }
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  case oct:
    lVar18 = -2;
    bVar6.container = out.container;
    lVar16 = 0;
    do {
      lVar17 = lVar16;
      lVar18 = lVar18 + 2;
      lVar16 = lVar17 + 1;
      bVar19 = (buffer<char16_t> *)0x7 < bVar6.container;
      bVar6.container = bVar6.container >> 3;
    } while (bVar19);
    iVar15 = (int)lVar16;
    if (((specs_00->field_0x9 & 0x80) != 0) &&
       (out.container != (buffer<char16_t> *)0x0 && specs_00->precision <= iVar15)) {
      uVar11 = 0x3000;
      if (uVar12 == 0) {
        uVar11 = 0x30;
      }
      uVar12 = (uVar11 | uVar12) + 0x1000000;
    }
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char16_t>::write_int_data(&local_88,iVar15,uVar12,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar12;
      local_78.write_digits.num_digits = iVar15;
      bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                        ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)this,specs_00,
                         local_88.size,local_88.size,(anon_class_40_3_03e05ccd *)&local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar6.container;
    }
    if ((uVar12 != 0) && (uVar11 = uVar12 & 0xffffff, (uVar12 & 0xffffff) != 0)) {
      do {
        if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
          (*(code *)**(undefined8 **)this)(this);
        }
        lVar3 = *(long *)(this + 0x10);
        *(long *)(this + 0x10) = lVar3 + 1;
        *(ushort *)(*(long *)(this + 8) + lVar3 * 2) = (ushort)uVar11 & 0xff;
        bVar19 = 0xff < uVar11;
        uVar11 = uVar11 >> 8;
      } while (bVar19);
    }
    lVar3 = *(long *)(this + 0x10);
    uVar1 = lVar3 + lVar16;
    if (*(ulong *)(this + 0x18) < uVar1) {
      lVar16 = 0;
    }
    else {
      *(ulong *)(this + 0x10) = uVar1;
      lVar16 = lVar3 * 2 + *(long *)(this + 8);
    }
    if (lVar16 != 0) {
      puVar7 = (ushort *)(lVar16 + lVar18);
      do {
        *puVar7 = (ushort)out.container & 7 | 0x30;
        puVar7 = puVar7 + -1;
        bVar19 = (buffer<char16_t> *)0x7 < out.container;
        out.container = out.container >> 3;
      } while (bVar19);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)(buffer<char16_t> *)this;
    }
    pbVar9 = (byte *)((long)&local_78.prefix + lVar17);
    pcVar13 = (char *)((long)&local_78.prefix + lVar17 + 1);
    do {
      *pbVar9 = (byte)out.container & 7 | 0x30;
      pbVar9 = pbVar9 + -1;
      bVar19 = (buffer<char16_t> *)0x7 < out.container;
      out.container = out.container >> 3;
    } while (bVar19);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar5 = (uint)(pVar2 != hex_upper) << 0xd | 0x5830;
      uVar11 = uVar5 << 8;
      if (uVar12 == 0) {
        uVar11 = uVar5;
      }
      uVar12 = (uVar11 | uVar12) + 0x2000000;
    }
    lVar18 = -2;
    bVar6.container = out.container;
    lVar16 = 0;
    do {
      lVar17 = lVar16;
      lVar18 = lVar18 + 2;
      lVar16 = lVar17 + 1;
      bVar19 = (buffer<char16_t> *)0xf < bVar6.container;
      bVar6.container = bVar6.container >> 4;
    } while (bVar19);
    if (specs_00->precision != -1 || specs_00->width != 0) {
      lVar18 = ((ulong)(pVar2 == hex_upper) << 0x20) + lVar16;
      write_int_data<char16_t>::write_int_data(&local_88,(int)lVar16,uVar12,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.write_digits.num_digits = (int)lVar18;
      local_78.write_digits.upper = SUB81((ulong)lVar18 >> 0x20,0);
      local_78.prefix = uVar12;
      bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                        ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)this,specs_00,
                         local_88.size,local_88.size,&local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar6.container;
    }
    if ((uVar12 != 0) && (uVar11 = uVar12 & 0xffffff, (uVar12 & 0xffffff) != 0)) {
      do {
        if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
          (*(code *)**(undefined8 **)this)(this);
        }
        lVar3 = *(long *)(this + 0x10);
        *(long *)(this + 0x10) = lVar3 + 1;
        *(ushort *)(*(long *)(this + 8) + lVar3 * 2) = (ushort)uVar11 & 0xff;
        bVar19 = 0xff < uVar11;
        uVar11 = uVar11 >> 8;
      } while (bVar19);
    }
    lVar3 = *(long *)(this + 0x10);
    uVar1 = lVar3 + lVar16;
    if (*(ulong *)(this + 0x18) < uVar1) {
      lVar16 = 0;
    }
    else {
      *(ulong *)(this + 0x10) = uVar1;
      lVar16 = lVar3 * 2 + *(long *)(this + 8);
    }
    if (lVar16 != 0) {
      pcVar13 = "0123456789abcdef";
      if (pVar2 == hex_upper) {
        pcVar13 = "0123456789ABCDEF";
      }
      psVar8 = (short *)(lVar16 + lVar18);
      do {
        *psVar8 = (short)pcVar13[(uint)out.container & 0xf];
        psVar8 = psVar8 + -1;
        bVar19 = (buffer<char16_t> *)0xf < out.container;
        out.container = out.container >> 4;
      } while (bVar19);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)(buffer<char16_t> *)this;
    }
    pcVar10 = (char *)((long)&local_78.prefix + lVar17);
    pcVar13 = (char *)((long)&local_78.prefix + lVar17 + 1);
    pcVar14 = "0123456789abcdef";
    if (pVar2 == hex_upper) {
      pcVar14 = "0123456789ABCDEF";
    }
    do {
      *pcVar10 = pcVar14[(uint)out.container & 0xf];
      pcVar10 = pcVar10 + -1;
      bVar19 = (buffer<char16_t> *)0xf < out.container;
      out.container = out.container >> 4;
    } while (bVar19);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar5 = (uint)(pVar2 != bin_upper) << 0xd | 0x4230;
      uVar11 = uVar5 << 8;
      if (uVar12 == 0) {
        uVar11 = uVar5;
      }
      uVar12 = (uVar11 | uVar12) + 0x2000000;
    }
    lVar18 = -2;
    bVar6.container = out.container;
    lVar16 = 0;
    do {
      lVar17 = lVar16;
      lVar18 = lVar18 + 2;
      lVar16 = lVar17 + 1;
      bVar19 = (buffer<char16_t> *)0x1 < bVar6.container;
      bVar6.container = bVar6.container >> 1;
    } while (bVar19);
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char16_t>::write_int_data(&local_88,(int)lVar16,uVar12,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar12;
      local_78.write_digits.num_digits = (int)lVar16;
      bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                        ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)this,specs_00,
                         local_88.size,local_88.size,(anon_class_40_3_03e05ccd *)&local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar6.container;
    }
    if ((uVar12 != 0) && (uVar11 = uVar12 & 0xffffff, (uVar12 & 0xffffff) != 0)) {
      do {
        if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
          (*(code *)**(undefined8 **)this)(this);
        }
        lVar3 = *(long *)(this + 0x10);
        *(long *)(this + 0x10) = lVar3 + 1;
        *(ushort *)(*(long *)(this + 8) + lVar3 * 2) = (ushort)uVar11 & 0xff;
        bVar19 = 0xff < uVar11;
        uVar11 = uVar11 >> 8;
      } while (bVar19);
    }
    lVar3 = *(long *)(this + 0x10);
    uVar1 = lVar3 + lVar16;
    if (*(ulong *)(this + 0x18) < uVar1) {
      lVar16 = 0;
    }
    else {
      *(ulong *)(this + 0x10) = uVar1;
      lVar16 = lVar3 * 2 + *(long *)(this + 8);
    }
    if (lVar16 != 0) {
      puVar7 = (ushort *)(lVar16 + lVar18);
      do {
        *puVar7 = (ushort)out.container & 1 | 0x30;
        puVar7 = puVar7 + -1;
        bVar19 = (buffer<char16_t> *)0x1 < out.container;
        out.container = out.container >> 1;
      } while (bVar19);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)(buffer<char16_t> *)this;
    }
    pbVar9 = (byte *)((long)&local_78.prefix + lVar17);
    pcVar13 = (char *)((long)&local_78.prefix + lVar17 + 1);
    do {
      *pbVar9 = (byte)out.container & 1 | 0x30;
      pbVar9 = pbVar9 + -1;
      bVar19 = (buffer<char16_t> *)0x1 < out.container;
      out.container = out.container >> 1;
    } while (bVar19);
    break;
  default:
    fmt::v8::detail::throw_format_error("invalid type specifier");
  case chr:
    local_78.prefix = CONCAT22(local_78.prefix._2_2_,(short)out.container);
    bVar6 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_char<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::basic_format_specs<char16_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                      ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)this,specs_00,1,1,
                       (anon_class_2_1_a8c68091 *)&local_78);
    return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar6.container;
  }
  bVar6 = copy_str_noinline<char16_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                    ((char *)&local_78,pcVar13,
                     (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)this);
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar6.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}